

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O3

void color_esycc_to_rgb(opj_image_t *image)

{
  byte bVar1;
  opj_image_comp_t *poVar2;
  OPJ_INT32 *pOVar3;
  OPJ_INT32 *pOVar4;
  OPJ_INT32 *pOVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint unaff_R15D;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  uint uVar17;
  
  poVar2 = image->comps;
  bVar1 = (byte)poVar2->prec;
  uVar7 = 1 << (bVar1 - 1 & 0x1f);
  if ((((image->numcomps < 3) || (poVar2->dx != poVar2[1].dx)) || (poVar2->dx != poVar2[2].dx)) ||
     ((poVar2->dy != poVar2[1].dy || (poVar2->dy != poVar2[2].dy)))) {
    color_esycc_to_rgb_cold_1();
  }
  else {
    uVar8 = poVar2->h * poVar2->w;
    if (uVar8 != 0) {
      uVar11 = ~(-1 << (bVar1 & 0x1f));
      pOVar3 = poVar2->data;
      pOVar4 = poVar2[1].data;
      pOVar5 = poVar2[2].data;
      uVar12 = 0;
      if (poVar2[1].sgnd == 0) {
        uVar12 = uVar7;
      }
      if (poVar2[2].sgnd != 0) {
        uVar7 = 0;
      }
      uVar9 = 0;
      do {
        fVar13 = (float)(int)(pOVar5[uVar9] - uVar7);
        fVar14 = (float)pOVar3[uVar9];
        fVar15 = (float)(int)(pOVar4[uVar9] - uVar12);
        uVar16 = (uint)(fVar13 * -0.7141128 + fVar14 * 1.0003 + fVar15 * -0.344125 + 0.5);
        uVar17 = (uint)(fVar13 * 1.40199 + fVar15 * -3.68e-05 + fVar14 + 0.5);
        uVar10 = uVar17;
        if ((int)uVar17 < 1) {
          uVar10 = 0;
        }
        auVar6._4_4_ = -(uint)((int)uVar11 < (int)uVar16);
        auVar6._0_4_ = -(uint)((int)uVar11 < (int)uVar16);
        auVar6._8_4_ = -(uint)((int)uVar11 < (int)uVar17);
        auVar6._12_4_ = -(uint)((int)uVar11 < (int)uVar17);
        uVar17 = movmskpd(unaff_R15D,auVar6);
        if ((uVar17 & 2) != 0) {
          uVar10 = uVar11;
        }
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        if ((uVar17 & 1) != 0) {
          uVar16 = uVar11;
        }
        unaff_R15D = (uint)(fVar13 * -8e-06 + fVar14 * 0.999823 + fVar15 * 1.77204 + 0.5);
        uVar17 = 0;
        if (0 < (int)unaff_R15D) {
          uVar17 = unaff_R15D;
        }
        pOVar3[uVar9] = uVar10;
        if ((int)uVar11 < (int)unaff_R15D) {
          uVar17 = uVar11;
        }
        pOVar4[uVar9] = uVar16;
        pOVar5[uVar9] = uVar17;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    image->color_space = OPJ_CLRSPC_SRGB;
  }
  return;
}

Assistant:

void color_esycc_to_rgb(opj_image_t *image)
{
	int y, cb, cr, sign1, sign2, val;
	unsigned int w, h, max, i;
	int flip_value = (1 << (image->comps[0].prec-1));
	int max_value = (1 << image->comps[0].prec) - 1;
	
	if (
		    (image->numcomps < 3)
		 || (image->comps[0].dx != image->comps[1].dx) || (image->comps[0].dx != image->comps[2].dx)
		 || (image->comps[0].dy != image->comps[1].dy) || (image->comps[0].dy != image->comps[2].dy)
	   ) {
		fprintf(stderr,"%s:%d:color_esycc_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,__LINE__);
		return;
	}
	
	w = image->comps[0].w;
	h = image->comps[0].h;
	
	sign1 = (int)image->comps[1].sgnd;
	sign2 = (int)image->comps[2].sgnd;
	
	max = w * h;
	
	for(i = 0; i < max; ++i)
	{
		
		y = image->comps[0].data[i]; cb = image->comps[1].data[i]; cr = image->comps[2].data[i];
		
		if( !sign1) cb -= flip_value;
		if( !sign2) cr -= flip_value;
		
		val = (int)
		((float)y - (float)0.0000368 * (float)cb
		 + (float)1.40199 * (float)cr + (float)0.5);
		
		if(val > max_value) val = max_value; else if(val < 0) val = 0;
		image->comps[0].data[i] = val;
		
		val = (int)
		((float)1.0003 * (float)y - (float)0.344125 * (float)cb
		 - (float)0.7141128 * (float)cr + (float)0.5);
		
		if(val > max_value) val = max_value; else if(val < 0) val = 0;
		image->comps[1].data[i] = val;
		
		val = (int)
		((float)0.999823 * (float)y + (float)1.77204 * (float)cb
		 - (float)0.000008 *(float)cr + (float)0.5);
		
		if(val > max_value) val = max_value; else if(val < 0) val = 0;
		image->comps[2].data[i] = val;
	}
	image->color_space = OPJ_CLRSPC_SRGB;

}